

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O2

void __thiscall
webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>::Frame
          (Frame<webfront::networking::TCPNetworkingTS> *this,
          span<const_std::byte,_18446744073709551615UL> dataHead,
          span<const_std::byte,_18446744073709551615UL> dataNext)

{
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  *this_00;
  Header *pHVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  Frame<webfront::networking::TCPNetworkingTS> *local_40;
  size_t local_38;
  
  _Var2 = dataNext._M_extent._M_extent_value;
  (this->super_Header).raw._M_elems[0] = 0;
  (this->super_Header).raw._M_elems[1] = 0;
  (this->super_Header).raw._M_elems[2] = 0;
  (this->super_Header).raw._M_elems[3] = 0;
  (this->super_Header).raw._M_elems[4] = 0;
  (this->super_Header).raw._M_elems[5] = 0;
  (this->super_Header).raw._M_elems[6] = 0;
  (this->super_Header).raw._M_elems[7] = 0;
  pHVar1 = &this->super_Header;
  (pHVar1->raw)._M_elems[6] = 0;
  (pHVar1->raw)._M_elems[7] = 0;
  (pHVar1->raw)._M_elems[8] = 0;
  (pHVar1->raw)._M_elems[9] = 0;
  (pHVar1->raw)._M_elems[10] = 0;
  (pHVar1->raw)._M_elems[0xb] = 0;
  (pHVar1->raw)._M_elems[0xc] = 0;
  (pHVar1->raw)._M_elems[0xd] = 0;
  this_00 = &this->buffers;
  (this->buffers).
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffers).
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers).
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Header).raw._M_elems[0] = 0x82;
  Header::setPayloadSize
            (&this->super_Header,
             _Var2._M_extent_value + dataHead._M_extent._M_extent_value._M_extent_value);
  local_40 = this;
  local_38 = Header::headerSize(&this->super_Header);
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte*,unsigned_long>
            ((vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
              *)this_00,(byte **)&local_40,&local_38);
  local_40 = (Frame<webfront::networking::TCPNetworkingTS> *)dataHead._M_ptr;
  local_38 = dataHead._M_extent._M_extent_value._M_extent_value;
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte_const*,unsigned_long>
            ((vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
              *)this_00,(byte **)&local_40,&local_38);
  if (_Var2._M_extent_value != 0) {
    local_40 = (Frame<webfront::networking::TCPNetworkingTS> *)dataNext._M_ptr;
    local_38 = _Var2._M_extent_value;
    std::
    vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
    ::emplace_back<std::byte_const*,unsigned_long>
              ((vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
                *)this_00,(byte **)&local_40,&local_38);
  }
  return;
}

Assistant:

Frame(std::span<const std::byte> dataHead, std::span<const std::byte> dataNext = {}) {
        setFIN(true);
        setOpcode(Opcode::binary);
        setPayloadSize(dataHead.size() + dataNext.size());
        buffers.emplace_back(raw.data(), headerSize());
        buffers.emplace_back(dataHead.data(), dataHead.size());
        if (!dataNext.empty()) buffers.emplace_back(dataNext.data(), dataNext.size());
    }